

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_table_column_metadata
              (sqlite3 *db,char *zDbName,char *zTableName,char *zColumnName,char **pzDataType,
              char **pzCollSeq,int *pNotNull,int *pPrimaryKey,int *pAutoinc)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Table *pTVar4;
  byte bVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  Column *pCVar13;
  long lVar14;
  bool bVar15;
  char *local_78;
  char *zErrMsg;
  uint local_54;
  sqlite3 *local_50;
  char *local_48;
  char **local_40;
  char **local_38;
  
  zErrMsg = (char *)0x0;
  local_40 = pzDataType;
  local_38 = pzCollSeq;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  sqlite3BtreeEnterAll(db);
  iVar2 = sqlite3Init(db,&zErrMsg);
  local_48 = zTableName;
  if (((iVar2 != 0) || (pTVar4 = sqlite3FindTable(db,zTableName,zDbName), pTVar4 == (Table *)0x0))
     || (pTVar4->pSelect != (Select *)0x0)) {
LAB_00128211:
    bVar1 = false;
    local_78 = (char *)0x0;
    uVar12 = 0;
    uVar10 = 0;
    uVar7 = 0;
    pcVar9 = (char *)0x0;
    goto LAB_0012822e;
  }
  bVar1 = true;
  local_78 = "INTEGER";
  if (zColumnName == (char *)0x0) {
LAB_00128452:
    pcVar6 = (char *)0x0;
    bVar15 = false;
    bVar5 = 1;
    uVar7 = 0;
  }
  else {
    local_54 = (uint)pTVar4->nCol;
    lVar14 = 0;
    uVar11 = 0;
    if (0 < pTVar4->nCol) {
      uVar11 = (ulong)local_54;
    }
    pCVar13 = (Column *)0x0;
    local_50 = db;
    for (uVar8 = 0; uVar11 != uVar8; uVar8 = uVar8 + 1) {
      pCVar13 = pTVar4->aCol;
      iVar3 = sqlite3StrICmp(*(char **)((long)&pCVar13->zName + lVar14),zColumnName);
      if (iVar3 == 0) {
        pCVar13 = (Column *)((long)&pCVar13->zName + lVar14);
        uVar11 = uVar8 & 0xffffffff;
        break;
      }
      pCVar13 = (Column *)((long)&pCVar13->zName + lVar14);
      lVar14 = lVar14 + 0x20;
    }
    db = local_50;
    uVar10 = (uint)uVar11;
    if (uVar10 == local_54) {
      if (((pTVar4->tabFlags & 0x20) != 0) || (iVar3 = sqlite3IsRowid(zColumnName), iVar3 == 0))
      goto LAB_00128211;
      uVar10 = (uint)pTVar4->iPKey;
      if ((int)uVar10 < 0) goto LAB_00128452;
      pCVar13 = pTVar4->aCol + (ushort)pTVar4->iPKey;
    }
    if (pCVar13 == (Column *)0x0) goto LAB_00128452;
    uVar7 = 0;
    local_78 = sqlite3ColumnType(pCVar13,(char *)0x0);
    pcVar6 = pCVar13->zColl;
    bVar15 = pCVar13->notNull != '\0';
    bVar5 = pCVar13->colFlags & 1;
    if (uVar10 == (int)pTVar4->iPKey) {
      uVar7 = pTVar4->tabFlags >> 3 & 1;
    }
  }
  uVar10 = (uint)bVar5;
  uVar12 = (uint)bVar15;
  pcVar9 = "BINARY";
  if (pcVar6 != (char *)0x0) {
    pcVar9 = pcVar6;
  }
LAB_0012822e:
  sqlite3BtreeLeaveAll(db);
  if (local_40 != (char **)0x0) {
    *local_40 = local_78;
  }
  if (local_38 != (char **)0x0) {
    *local_38 = pcVar9;
  }
  if (pNotNull != (int *)0x0) {
    *pNotNull = uVar12;
  }
  if (pPrimaryKey != (int *)0x0) {
    *pPrimaryKey = uVar10;
  }
  if (pAutoinc != (int *)0x0) {
    *pAutoinc = uVar7;
  }
  if (iVar2 == 0 && !bVar1) {
    sqlite3DbFree(db,zErrMsg);
    zErrMsg = sqlite3MPrintf(db,"no such table column: %s.%s",local_48,zColumnName);
    iVar2 = 1;
  }
  pcVar6 = "%s";
  if (zErrMsg == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  sqlite3ErrorWithMsg(db,iVar2,pcVar6);
  sqlite3DbFree(db,zErrMsg);
  iVar2 = sqlite3ApiExit(db,iVar2);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar2;
}

Assistant:

SQLITE_API int sqlite3_table_column_metadata(
  sqlite3 *db,                /* Connection handle */
  const char *zDbName,        /* Database name or NULL */
  const char *zTableName,     /* Table name */
  const char *zColumnName,    /* Column name */
  char const **pzDataType,    /* OUTPUT: Declared data type */
  char const **pzCollSeq,     /* OUTPUT: Collation sequence name */
  int *pNotNull,              /* OUTPUT: True if NOT NULL constraint exists */
  int *pPrimaryKey,           /* OUTPUT: True if column part of PK */
  int *pAutoinc               /* OUTPUT: True if column is auto-increment */
){
  int rc;
  char *zErrMsg = 0;
  Table *pTab = 0;
  Column *pCol = 0;
  int iCol = 0;
  char const *zDataType = 0;
  char const *zCollSeq = 0;
  int notnull = 0;
  int primarykey = 0;
  int autoinc = 0;


#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zTableName==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif

  /* Ensure the database schema has been loaded */
  sqlite3_mutex_enter(db->mutex);
  sqlite3BtreeEnterAll(db);
  rc = sqlite3Init(db, &zErrMsg);
  if( SQLITE_OK!=rc ){
    goto error_out;
  }

  /* Locate the table in question */
  pTab = sqlite3FindTable(db, zTableName, zDbName);
  if( !pTab || pTab->pSelect ){
    pTab = 0;
    goto error_out;
  }

  /* Find the column for which info is requested */
  if( zColumnName==0 ){
    /* Query for existance of table only */
  }else{
    for(iCol=0; iCol<pTab->nCol; iCol++){
      pCol = &pTab->aCol[iCol];
      if( 0==sqlite3StrICmp(pCol->zName, zColumnName) ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      if( HasRowid(pTab) && sqlite3IsRowid(zColumnName) ){
        iCol = pTab->iPKey;
        pCol = iCol>=0 ? &pTab->aCol[iCol] : 0;
      }else{
        pTab = 0;
        goto error_out;
      }
    }
  }

  /* The following block stores the meta information that will be returned
  ** to the caller in local variables zDataType, zCollSeq, notnull, primarykey
  ** and autoinc. At this point there are two possibilities:
  ** 
  **     1. The specified column name was rowid", "oid" or "_rowid_" 
  **        and there is no explicitly declared IPK column. 
  **
  **     2. The table is not a view and the column name identified an 
  **        explicitly declared column. Copy meta information from *pCol.
  */ 
  if( pCol ){
    zDataType = sqlite3ColumnType(pCol,0);
    zCollSeq = pCol->zColl;
    notnull = pCol->notNull!=0;
    primarykey  = (pCol->colFlags & COLFLAG_PRIMKEY)!=0;
    autoinc = pTab->iPKey==iCol && (pTab->tabFlags & TF_Autoincrement)!=0;
  }else{
    zDataType = "INTEGER";
    primarykey = 1;
  }
  if( !zCollSeq ){
    zCollSeq = sqlite3StrBINARY;
  }

error_out:
  sqlite3BtreeLeaveAll(db);

  /* Whether the function call succeeded or failed, set the output parameters
  ** to whatever their local counterparts contain. If an error did occur,
  ** this has the effect of zeroing all output parameters.
  */
  if( pzDataType ) *pzDataType = zDataType;
  if( pzCollSeq ) *pzCollSeq = zCollSeq;
  if( pNotNull ) *pNotNull = notnull;
  if( pPrimaryKey ) *pPrimaryKey = primarykey;
  if( pAutoinc ) *pAutoinc = autoinc;

  if( SQLITE_OK==rc && !pTab ){
    sqlite3DbFree(db, zErrMsg);
    zErrMsg = sqlite3MPrintf(db, "no such table column: %s.%s", zTableName,
        zColumnName);
    rc = SQLITE_ERROR;
  }
  sqlite3ErrorWithMsg(db, rc, (zErrMsg?"%s":0), zErrMsg);
  sqlite3DbFree(db, zErrMsg);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}